

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

DistributionMapping amrex::DistributionMapping::makeKnapSack(MultiFab *weight,int nmax)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  DistributionMapping DVar2;
  Real eff;
  int nprocs;
  Vector<long,_std::allocator<long>_> cost;
  DistributionMapping *r;
  bool sort;
  int in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd4;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffffd8;
  DistributionMapping *in_stack_ffffffffffffffe0;
  
  anon_unknown_22::gather_weights
            ((MultiFab *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  iVar1 = ParallelContext::NProcsSub();
  sort = false;
  DistributionMapping((DistributionMapping *)0x11f9606);
  KnapSackProcessorMap
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
             (Real *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),(bool)in_stack_ffffffffffffffc7,
             in_stack_ffffffffffffffc0,sort);
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0x11f9682);
  DVar2.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  DVar2.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (DistributionMapping)
         DVar2.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeKnapSack (const MultiFab& weight, int nmax)
{
    BL_PROFILE("makeKnapSack");
    Vector<Long> cost = gather_weights(weight);
    int nprocs = ParallelContext::NProcsSub();
    Real eff;
    DistributionMapping r;
    r.KnapSackProcessorMap(cost, nprocs, &eff, true, nmax);
    return r;
}